

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVR3File.cpp
# Opt level: O3

void __thiscall BVR3File::BVR3File(BVR3File *this,vector<char,_std::allocator<char>_> *buf)

{
  pointer *ppBVar1;
  string *psVar2;
  pointer *pppcVar3;
  char cVar4;
  pointer __src;
  iterator __position;
  pointer pBVar5;
  double dVar6;
  int iVar7;
  size_t __size;
  _List_node_base **pp_Var8;
  BVR3File *pBVar9;
  _List_node_base *p_Var10;
  byte bVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  char *pcVar15;
  _List_iterator<std::pair<BRDPoint,_BRDPoint>_> __position_00;
  long *plVar16;
  BRDPoint *pBVar17;
  int iVar18;
  ulong *puVar19;
  BRDPoint BVar20;
  size_type *psVar21;
  long *plVar22;
  int iVar23;
  size_t __n;
  ulong uVar24;
  value_type vVar25;
  _List_node_base *p_Var26;
  _List_node_base *p_Var27;
  int iVar28;
  char *pold_1;
  value_type vVar29;
  _List_node_base *p_Var30;
  int iVar31;
  _List_node_base *p_Var32;
  _List_node_base *p_Var33;
  pointer ppcVar34;
  ulong uVar35;
  _List_node_base *p_Var36;
  char *pold;
  _List_node_base *p_Var37;
  char *p;
  char *s;
  value_type first_outline_segment;
  list<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
  outline_segments;
  vector<char_*,_std::allocator<char_*>_> lines;
  char *arena;
  char *arena_end;
  BRDPoint start_point;
  BRDPart part;
  BRDPart blank_part;
  _List_node_base *local_218;
  _List_node_base *local_210;
  undefined1 local_208 [24];
  _List_node_base *p_Stack_1f0;
  undefined1 local_1e8 [24];
  long lStack_1d0;
  vector<char_*,_std::allocator<char_*>_> local_1c8;
  long lStack_1b0;
  _List_node_base local_1a0;
  _List_node_base local_190;
  BVR3File *local_180;
  _List_node_base local_178;
  undefined1 local_168 [8];
  undefined8 uStack_160;
  undefined8 local_158;
  BRDPoint BStack_150;
  double local_148;
  long *plStack_140;
  char *pcStack_138;
  BRDPoint local_128;
  BRDPoint BStack_120;
  undefined8 local_118;
  BRDPoint BStack_110;
  long *local_108;
  char *pcStack_100;
  long local_f8 [2];
  value_type local_e8;
  undefined1 local_e0 [8];
  _Alloc_hider local_d8;
  size_type local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_c8;
  undefined8 local_b8;
  uint uStack_b0;
  int iStack_ac;
  int iStack_a8;
  BRDPoint BStack_a4;
  long *local_98;
  ulong *local_90;
  long local_88;
  ulong auStack_80 [2];
  ulong local_70;
  uint uStack_68;
  int iStack_64;
  int iStack_60;
  BRDPoint BStack_5c;
  vector<BRDPin,std::allocator<BRDPin>> *local_50;
  vector<BRDPart,_std::allocator<BRDPart>_> *local_48;
  char *local_40;
  pointer local_38;
  
  BRDFileBase::BRDFileBase(&this->super_BRDFileBase);
  (this->super_BRDFileBase)._vptr_BRDFileBase = (_func_int **)&PTR__BRDFileBase_0022b380;
  uVar24 = (long)(buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                 super__Vector_impl_data._M_start;
  local_40 = setlocale(1,"C");
  local_180 = this;
  if (4 < uVar24) {
    __size = (uVar24 + 1) * 3;
    pcVar15 = (char *)calloc(1,__size);
    (this->super_BRDFileBase).file_buf = pcVar15;
    if (pcVar15 != (char *)0x0) {
      __src = (buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data
              ._M_start;
      __n = (long)(buf->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                  super__Vector_impl_data._M_finish - (long)__src;
      if (__n != 0) {
        memmove(pcVar15,__src,__n);
      }
      pcVar15[uVar24] = '\0';
      local_1a0._M_next = (_List_node_base *)(pcVar15 + uVar24 + 1);
      local_178._M_next = (_List_node_base *)(pcVar15 + (__size - 1));
      pcVar15[__size - 1] = '\0';
      local_90 = auStack_80;
      local_98 = (long *)0x0;
      local_88 = 0;
      auStack_80[0] = auStack_80[0] & 0xffffffffffffff00;
      local_70 = 0;
      uStack_68 = 0;
      iStack_64 = 0;
      iStack_60 = 0;
      BStack_5c.x = 0;
      BStack_5c.y = 0;
      local_128.x = 0;
      local_128.y = 0;
      BStack_120.x = 0;
      BStack_120.y = 0;
      local_118 = (ulong)local_118._4_4_ << 0x20;
      local_108 = (long *)0x0;
      pcStack_100 = (char *)0x0;
      local_d8._M_p = (pointer)&aStack_c8;
      local_e0 = (undefined1  [8])0x0;
      local_d0 = 0;
      aStack_c8._M_allocated_capacity = aStack_c8._M_allocated_capacity & 0xffffffffffffff00;
      local_b8 = 0;
      uStack_b0 = 0;
      iStack_ac = 0;
      iStack_a8 = 0;
      BStack_a4.x = 0;
      BStack_a4.y = 0;
      local_158 = (ulong)local_158._4_4_ << 0x20;
      local_168._0_4_ = 0;
      local_168._4_4_ = 0;
      uStack_160._0_4_ = 0;
      uStack_160._4_4_ = 0;
      BStack_150 = (BRDPoint)0x1ea23f;
      local_148 = 0.5;
      plStack_140 = (long *)0x0;
      pcStack_138 = (char *)0x0;
      local_1e8._0_8_ = local_1e8;
      local_1e8._16_8_ = 0;
      local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_1e8._8_8_ = local_1e8._0_8_;
      stringfile(pcVar15,&local_1c8);
      local_38 = local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      if (local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
          super__Vector_impl_data._M_start !=
          local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        local_178._M_prev = (_List_node_base *)&(local_180->super_BRDFileBase).format;
        local_50 = (vector<BRDPin,std::allocator<BRDPin>> *)&(local_180->super_BRDFileBase).pins;
        local_48 = &(local_180->super_BRDFileBase).parts;
        ppcVar34 = local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                   super__Vector_impl_data._M_start;
        do {
          pcVar15 = *ppcVar34;
          p_Var32 = (_List_node_base *)(pcVar15 + 0xb);
          p_Var30 = (_List_node_base *)(pcVar15 + 10);
          p_Var10 = (_List_node_base *)(pcVar15 + 0xc);
          p_Var27 = (_List_node_base *)(pcVar15 + 0x11);
          do {
            p_Var37 = p_Var27;
            p_Var26 = p_Var10;
            p_Var36 = p_Var30;
            p_Var33 = p_Var32;
            bVar11 = *(byte *)((long)&p_Var37[-2]._M_prev + 7);
            iVar12 = isspace((uint)bVar11);
            p_Var27 = (_List_node_base *)((long)&p_Var37->_M_next + 1);
            p_Var32 = (_List_node_base *)((long)&p_Var33->_M_next + 1);
            p_Var30 = (_List_node_base *)((long)&p_Var36->_M_next + 1);
            p_Var10 = (_List_node_base *)((long)&p_Var26->_M_next + 1);
          } while (iVar12 != 0);
          if (bVar11 != 0) {
            p_Var32 = (_List_node_base *)((long)&p_Var37[-2]._M_prev + 7);
            local_218 = p_Var32;
            iVar12 = strncmp((char *)p_Var32,"PART_NAME ",10);
            if (iVar12 == 0) {
              p_Var27 = (_List_node_base *)((long)&p_Var37[-1]._M_prev + 1);
              bVar11 = *(byte *)((long)&p_Var37[-1]._M_prev + 1);
              local_218 = p_Var27;
              if (bVar11 != 0) {
                do {
                  p_Var27 = p_Var33;
                  iVar12 = isspace((uint)bVar11);
                  p_Var33 = p_Var27;
                  if (iVar12 == 0) break;
                  bVar11 = *(byte *)&p_Var27->_M_next;
                  p_Var33 = (_List_node_base *)((long)&p_Var27->_M_next + 1);
                  local_218 = p_Var27;
                } while (bVar11 != 0);
                p_Var27 = (_List_node_base *)((long)&p_Var33[-1]._M_prev + 7);
              }
              bVar11 = *(byte *)&p_Var27->_M_next;
              local_210 = p_Var27;
              if (bVar11 != 0) {
                p_Var27 = (_List_node_base *)((long)&p_Var27->_M_next + 1);
                do {
                  p_Var32 = p_Var27;
                  iVar12 = isspace((uint)bVar11);
                  p_Var27 = p_Var32;
                  if (iVar12 != 0) break;
                  bVar11 = *(byte *)&p_Var32->_M_next;
                  p_Var27 = (_List_node_base *)((long)&p_Var32->_M_next + 1);
                  local_218 = p_Var32;
                } while (bVar11 != 0);
                p_Var27 = (_List_node_base *)((long)&p_Var27[-1]._M_prev + 7);
              }
              *(char *)&p_Var27->_M_next = '\0';
              local_218 = (_List_node_base *)((long)&local_218->_M_next + 1);
              local_e0 = (undefined1  [8])
                         fix_to_utf8((char *)local_210,(char **)&local_1a0,(char *)local_178._M_next
                                    );
            }
            else {
              iVar12 = strncmp((char *)p_Var32,"PART_SIDE ",10);
              if (iVar12 == 0) {
                p_Var27 = (_List_node_base *)((long)&p_Var37[-1]._M_prev + 1);
                bVar11 = *(byte *)((long)&p_Var37[-1]._M_prev + 1);
                local_218 = p_Var27;
                if (bVar11 != 0) {
                  do {
                    p_Var27 = p_Var33;
                    iVar12 = isspace((uint)bVar11);
                    p_Var33 = p_Var27;
                    if (iVar12 == 0) break;
                    bVar11 = *(byte *)&p_Var27->_M_next;
                    p_Var33 = (_List_node_base *)((long)&p_Var27->_M_next + 1);
                    local_218 = p_Var27;
                  } while (bVar11 != 0);
                  p_Var27 = (_List_node_base *)((long)&p_Var33[-1]._M_prev + 7);
                }
                bVar11 = *(byte *)&p_Var27->_M_next;
                local_210 = p_Var27;
                if (bVar11 != 0) {
                  p_Var27 = (_List_node_base *)((long)&p_Var27->_M_next + 1);
                  do {
                    p_Var32 = p_Var27;
                    iVar12 = isspace((uint)bVar11);
                    p_Var27 = p_Var32;
                    if (iVar12 != 0) break;
                    bVar11 = *(byte *)&p_Var32->_M_next;
                    p_Var27 = (_List_node_base *)((long)&p_Var32->_M_next + 1);
                    local_218 = p_Var32;
                  } while (bVar11 != 0);
                  p_Var27 = (_List_node_base *)((long)&p_Var27[-1]._M_prev + 7);
                }
                *(char *)&p_Var27->_M_next = '\0';
                local_218 = (_List_node_base *)((long)&local_218->_M_next + 1);
                pcVar15 = fix_to_utf8((char *)local_210,(char **)&local_1a0,
                                      (char *)local_178._M_next);
                cVar4 = *pcVar15;
                if (cVar4 == 'B') {
                  if (pcVar15[1] == '\0') {
                    local_b8 = CONCAT44(local_b8._4_4_,1);
                  }
                }
                else if (cVar4 == 'O') {
                  if (pcVar15[1] == '\0') {
                    local_b8 = (ulong)local_b8._4_4_ << 0x20;
                  }
                }
                else if ((cVar4 == 'T') && (pcVar15[1] == '\0')) {
                  local_b8 = CONCAT44(local_b8._4_4_,2);
                }
              }
              else {
                iVar12 = strncmp((char *)p_Var32,"PART_ORIGIN ",0xc);
                if (iVar12 != 0) {
                  iVar12 = strncmp((char *)p_Var32,"PART_MOUNT ",0xb);
                  if (iVar12 == 0) {
                    p_Var27 = (_List_node_base *)((long)&p_Var37[-1]._M_prev + 2);
                    bVar11 = *(byte *)((long)&p_Var37[-1]._M_prev + 2);
                    local_218 = p_Var27;
                    if (bVar11 != 0) {
                      do {
                        p_Var27 = p_Var26;
                        iVar12 = isspace((uint)bVar11);
                        p_Var26 = p_Var27;
                        if (iVar12 == 0) break;
                        bVar11 = *(byte *)&p_Var27->_M_next;
                        p_Var26 = (_List_node_base *)((long)&p_Var27->_M_next + 1);
                        local_218 = p_Var27;
                      } while (bVar11 != 0);
                      p_Var27 = (_List_node_base *)((long)&p_Var26[-1]._M_prev + 7);
                    }
                    bVar11 = *(byte *)&p_Var27->_M_next;
                    local_210 = p_Var27;
                    if (bVar11 != 0) {
                      p_Var27 = (_List_node_base *)((long)&p_Var27->_M_next + 1);
                      do {
                        p_Var32 = p_Var27;
                        iVar12 = isspace((uint)bVar11);
                        p_Var27 = p_Var32;
                        if (iVar12 != 0) break;
                        bVar11 = *(byte *)&p_Var32->_M_next;
                        p_Var27 = (_List_node_base *)((long)&p_Var32->_M_next + 1);
                        local_218 = p_Var32;
                      } while (bVar11 != 0);
                      p_Var27 = (_List_node_base *)((long)&p_Var27[-1]._M_prev + 7);
                    }
                    *(char *)&p_Var27->_M_next = '\0';
                    local_218 = (_List_node_base *)((long)&local_218->_M_next + 1);
                    pcVar15 = fix_to_utf8((char *)local_210,(char **)&local_1a0,
                                          (char *)local_178._M_next);
                    iVar12 = strcmp(pcVar15,"SMD");
                    if (iVar12 == 0) {
                      local_b8 = local_b8 & 0xffffffff;
                    }
                    else {
                      local_b8 = CONCAT44(1,(BRDPartMountingSide)local_b8);
                    }
                  }
                  else {
                    iVar12 = strncmp((char *)p_Var32,"PART_OUTLINE_RELATIVE ",0x16);
                    if ((iVar12 != 0) &&
                       (iVar12 = strncmp((char *)p_Var32,"PIN_ID ",7), iVar12 != 0)) {
                      iVar12 = strncmp((char *)p_Var32,"PIN_NUMBER ",0xb);
                      if (iVar12 == 0) {
                        p_Var27 = (_List_node_base *)((long)&p_Var37[-1]._M_prev + 2);
                        bVar11 = *(byte *)((long)&p_Var37[-1]._M_prev + 2);
                        local_218 = p_Var27;
                        if (bVar11 != 0) {
                          do {
                            p_Var27 = p_Var26;
                            iVar12 = isspace((uint)bVar11);
                            p_Var26 = p_Var27;
                            if (iVar12 == 0) break;
                            bVar11 = *(byte *)&p_Var27->_M_next;
                            p_Var26 = (_List_node_base *)((long)&p_Var27->_M_next + 1);
                            local_218 = p_Var27;
                          } while (bVar11 != 0);
                          p_Var27 = (_List_node_base *)((long)&p_Var26[-1]._M_prev + 7);
                        }
                        bVar11 = *(byte *)&p_Var27->_M_next;
                        local_210 = p_Var27;
                        if (bVar11 != 0) {
                          p_Var27 = (_List_node_base *)((long)&p_Var27->_M_next + 1);
                          do {
                            p_Var32 = p_Var27;
                            iVar12 = isspace((uint)bVar11);
                            p_Var27 = p_Var32;
                            if (iVar12 != 0) break;
                            bVar11 = *(byte *)&p_Var32->_M_next;
                            p_Var27 = (_List_node_base *)((long)&p_Var32->_M_next + 1);
                            local_218 = p_Var32;
                          } while (bVar11 != 0);
                          p_Var27 = (_List_node_base *)((long)&p_Var27[-1]._M_prev + 7);
                        }
                        *(char *)&p_Var27->_M_next = '\0';
                        local_218 = (_List_node_base *)((long)&local_218->_M_next + 1);
                        plStack_140 = (long *)fix_to_utf8((char *)local_210,(char **)&local_1a0,
                                                          (char *)local_178._M_next);
                      }
                      else {
                        iVar12 = strncmp((char *)p_Var32,"PIN_NAME ",9);
                        if (iVar12 == 0) {
                          p_Var27 = (_List_node_base *)&p_Var37[-1]._M_prev;
                          bVar11 = *(byte *)&p_Var37[-1]._M_prev;
                          local_218 = p_Var27;
                          if (bVar11 != 0) {
                            do {
                              p_Var27 = p_Var36;
                              iVar12 = isspace((uint)bVar11);
                              p_Var36 = p_Var27;
                              if (iVar12 == 0) break;
                              bVar11 = *(byte *)&p_Var27->_M_next;
                              p_Var36 = (_List_node_base *)((long)&p_Var27->_M_next + 1);
                              local_218 = p_Var27;
                            } while (bVar11 != 0);
                            p_Var27 = (_List_node_base *)((long)&p_Var36[-1]._M_prev + 7);
                          }
                          bVar11 = *(byte *)&p_Var27->_M_next;
                          local_210 = p_Var27;
                          if (bVar11 != 0) {
                            p_Var27 = (_List_node_base *)((long)&p_Var27->_M_next + 1);
                            do {
                              p_Var32 = p_Var27;
                              iVar12 = isspace((uint)bVar11);
                              p_Var27 = p_Var32;
                              if (iVar12 != 0) break;
                              bVar11 = *(byte *)&p_Var32->_M_next;
                              p_Var27 = (_List_node_base *)((long)&p_Var32->_M_next + 1);
                              local_218 = p_Var32;
                            } while (bVar11 != 0);
                            p_Var27 = (_List_node_base *)((long)&p_Var27[-1]._M_prev + 7);
                          }
                          *(char *)&p_Var27->_M_next = '\0';
                          local_218 = (_List_node_base *)((long)&local_218->_M_next + 1);
                          pcStack_138 = fix_to_utf8((char *)local_210,(char **)&local_1a0,
                                                    (char *)local_178._M_next);
                        }
                        else {
                          iVar12 = strncmp((char *)p_Var32,"PIN_SIDE ",9);
                          if (iVar12 == 0) {
                            p_Var27 = (_List_node_base *)&p_Var37[-1]._M_prev;
                            bVar11 = *(byte *)&p_Var37[-1]._M_prev;
                            local_218 = p_Var27;
                            if (bVar11 != 0) {
                              do {
                                p_Var27 = p_Var36;
                                iVar12 = isspace((uint)bVar11);
                                p_Var36 = p_Var27;
                                if (iVar12 == 0) break;
                                bVar11 = *(byte *)&p_Var27->_M_next;
                                p_Var36 = (_List_node_base *)((long)&p_Var27->_M_next + 1);
                                local_218 = p_Var27;
                              } while (bVar11 != 0);
                              p_Var27 = (_List_node_base *)((long)&p_Var36[-1]._M_prev + 7);
                            }
                            bVar11 = *(byte *)&p_Var27->_M_next;
                            local_210 = p_Var27;
                            if (bVar11 != 0) {
                              p_Var27 = (_List_node_base *)((long)&p_Var27->_M_next + 1);
                              do {
                                p_Var32 = p_Var27;
                                iVar12 = isspace((uint)bVar11);
                                p_Var27 = p_Var32;
                                if (iVar12 != 0) break;
                                bVar11 = *(byte *)&p_Var32->_M_next;
                                p_Var27 = (_List_node_base *)((long)&p_Var32->_M_next + 1);
                                local_218 = p_Var32;
                              } while (bVar11 != 0);
                              p_Var27 = (_List_node_base *)((long)&p_Var27[-1]._M_prev + 7);
                            }
                            *(char *)&p_Var27->_M_next = '\0';
                            local_218 = (_List_node_base *)((long)&local_218->_M_next + 1);
                            pcVar15 = fix_to_utf8((char *)local_210,(char **)&local_1a0,
                                                  (char *)local_178._M_next);
                            cVar4 = *pcVar15;
                            if (cVar4 == 'B') {
                              if (pcVar15[1] == '\0') {
                                local_158 = CONCAT44(local_158._4_4_,1);
                              }
                            }
                            else if (cVar4 == 'O') {
                              if (pcVar15[1] == '\0') {
                                local_158 = (ulong)local_158._4_4_ << 0x20;
                              }
                            }
                            else if ((cVar4 == 'T') && (pcVar15[1] == '\0')) {
                              local_158 = CONCAT44(local_158._4_4_,2);
                            }
                          }
                          else {
                            iVar12 = strncmp((char *)p_Var32,"PIN_ORIGIN ",0xb);
                            if (iVar12 == 0) {
                              local_218 = (_List_node_base *)((long)&p_Var37[-1]._M_prev + 2);
                              dVar6 = strtod((char *)local_218,(char **)&local_218);
                              dVar6 = trunc(dVar6);
                              local_168._0_4_ = (int)dVar6;
                              dVar6 = strtod((char *)local_218,(char **)&local_218);
                              dVar6 = trunc(dVar6);
                              local_168._4_4_ = (int)dVar6;
                            }
                            else {
                              iVar12 = strncmp((char *)p_Var32,"PIN_RADIUS ",0xb);
                              if (iVar12 == 0) {
                                local_218 = (_List_node_base *)((long)&p_Var37[-1]._M_prev + 2);
                                local_148 = strtod((char *)local_218,(char **)&local_218);
                              }
                              else {
                                iVar12 = strncmp((char *)p_Var32,"PIN_NET ",8);
                                if (iVar12 == 0) {
                                  local_218 = (_List_node_base *)((long)&p_Var37[-1]._M_next + 7);
                                  local_208._8_8_ = &local_210;
                                  local_208._16_8_ = &local_1a0;
                                  p_Stack_1f0 = &local_178;
                                  local_208._0_8_ = &local_218;
                                  BStack_150 = (BRDPoint)
                                               BVR3File::anon_class_32_4_fa413470::operator()
                                                         ((anon_class_32_4_fa413470 *)local_208);
                                }
                                else {
                                  iVar12 = strncmp((char *)p_Var32,"PIN_TYPE ",9);
                                  if (((iVar12 != 0) &&
                                      (iVar12 = strncmp((char *)p_Var32,"PIN_COMMENT ",0xc),
                                      iVar12 != 0)) &&
                                     (iVar12 = strncmp((char *)p_Var32,"PIN_OUTLINE_RELATIVE ",0x15)
                                     , iVar12 != 0)) {
                                    iVar12 = strcmp((char *)p_Var32,"PIN_END");
                                    if (iVar12 == 0) {
                                      uVar14 = (int)((ulong)((long)(local_180->super_BRDFileBase).
                                                                   parts.
                                                  super__Vector_base<BRDPart,_std::allocator<BRDPart>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)(local_180->super_BRDFileBase).parts.
                                                                                                                
                                                  super__Vector_base<BRDPart,_std::allocator<BRDPart>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                                               0x38e38e39 + 1;
                                      uStack_160._4_4_ = uVar14;
                                      __position._M_current =
                                           (local_180->super_BRDFileBase).pins.
                                           super__Vector_base<BRDPin,_std::allocator<BRDPin>_>.
                                           _M_impl.super__Vector_impl_data._M_finish;
                                      if (__position._M_current ==
                                          (local_180->super_BRDFileBase).pins.
                                          super__Vector_base<BRDPin,_std::allocator<BRDPin>_>.
                                          _M_impl.super__Vector_impl_data._M_end_of_storage) {
                                        std::vector<BRDPin,std::allocator<BRDPin>>::
                                        _M_realloc_insert<BRDPin_const&>
                                                  (local_50,__position,(BRDPin *)local_168);
                                      }
                                      else {
                                        (__position._M_current)->name = pcStack_138;
                                        (__position._M_current)->radius = local_148;
                                        (__position._M_current)->snum = (char *)plStack_140;
                                        *(long *)&(__position._M_current)->side = local_158;
                                        (__position._M_current)->net = (char *)BStack_150;
                                        ((__position._M_current)->pos).x = local_168._0_4_;
                                        ((__position._M_current)->pos).y = local_168._4_4_;
                                        (__position._M_current)->probe = (int)uStack_160;
                                        (__position._M_current)->part = uVar14;
                                        ppBVar1 = &(local_180->super_BRDFileBase).pins.
                                                                                                      
                                                  super__Vector_base<BRDPin,_std::allocator<BRDPin>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish;
                                        *ppBVar1 = *ppBVar1 + 1;
                                      }
                                      local_158 = local_118;
                                      local_168 = (undefined1  [8])local_128;
                                      uStack_160._0_4_ = BStack_120.x;
                                      uStack_160._4_4_ = BStack_120.y;
                                      BStack_150 = (BRDPoint)0x1ea23f;
                                      local_148 = 0.5;
                                      plStack_140 = local_108;
                                      pcStack_138 = pcStack_100;
                                    }
                                    else {
                                      iVar12 = strcmp((char *)p_Var32,"PART_END");
                                      if (iVar12 == 0) {
                                        uStack_b0 = (int)((ulong)((long)(local_180->
                                                                        super_BRDFileBase).pins.
                                                                                                                                                
                                                  super__Vector_base<BRDPin,_std::allocator<BRDPin>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)(local_180->super_BRDFileBase).pins.
                                                                                                                
                                                  super__Vector_base<BRDPin,_std::allocator<BRDPin>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3) *
                                                  -0x49249249;
                                        std::vector<BRDPart,_std::allocator<BRDPart>_>::push_back
                                                  (local_48,(value_type *)local_e0);
                                        local_e0 = (undefined1  [8])local_98;
                                        std::__cxx11::string::_M_assign((string *)&local_d8);
                                        local_b8 = local_70;
                                        BStack_a4 = BStack_5c;
                                        iStack_a8 = iStack_60;
                                        uStack_b0 = uStack_68;
                                        iStack_ac = iStack_64;
                                      }
                                      else {
                                        iVar12 = strncmp((char *)p_Var32,"OUTLINE_POINTS ",0xf);
                                        if (iVar12 == 0) {
                                          cVar4 = *(char *)((long)&p_Var37[-1]._M_prev + 6);
                                          p_Var27 = (_List_node_base *)
                                                    ((long)&p_Var37[-1]._M_prev + 6);
                                          while (local_218 = p_Var27, cVar4 != '\0') {
                                            local_208._0_8_ = (_List_node_base *)0x0;
                                            dVar6 = strtod((char *)p_Var27,(char **)&local_218);
                                            dVar6 = trunc(dVar6);
                                            local_208._0_4_ = (int)dVar6;
                                            dVar6 = strtod((char *)local_218,(char **)&local_218);
                                            dVar6 = trunc(dVar6);
                                            local_208._4_4_ = (int)dVar6;
                                            if (p_Var27 == local_218) break;
                                            std::vector<BRDPoint,_std::allocator<BRDPoint>_>::
                                            push_back((vector<BRDPoint,_std::allocator<BRDPoint>_> *
                                                      )local_178._M_prev,(value_type *)local_208);
                                            p_Var27 = local_218;
                                            cVar4 = *(char *)&local_218->_M_next;
                                          }
                                        }
                                        else {
                                          iVar12 = strncmp((char *)p_Var32,"OUTLINE_SEGMENTED ",0x12
                                                          );
                                          if (iVar12 == 0) {
                                            cVar4 = *(char *)&p_Var27->_M_next;
                                            while (local_218 = p_Var27, cVar4 != '\0') {
                                              local_208._0_8_ = (_List_node_base *)0x0;
                                              local_208._8_4_ = 0;
                                              local_208._12_4_ = 0;
                                              dVar6 = strtod((char *)p_Var27,(char **)&local_218);
                                              dVar6 = trunc(dVar6);
                                              local_208._0_4_ = (int)dVar6;
                                              dVar6 = strtod((char *)local_218,(char **)&local_218);
                                              dVar6 = trunc(dVar6);
                                              local_208._4_4_ = (int)dVar6;
                                              dVar6 = strtod((char *)local_218,(char **)&local_218);
                                              dVar6 = trunc(dVar6);
                                              local_208._8_4_ = (int)dVar6;
                                              dVar6 = strtod((char *)local_218,(char **)&local_218);
                                              dVar6 = trunc(dVar6);
                                              local_208._12_4_ = (int)dVar6;
                                              if (p_Var27 == local_218) break;
                                              std::__cxx11::
                                              list<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
                                              ::push_back((
                                                  list<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
                                                  *)local_1e8,(value_type *)local_208);
                                              p_Var27 = local_218;
                                              cVar4 = *(char *)&local_218->_M_next;
                                            }
                                            if ((_List_node_base *)local_1e8._0_8_ !=
                                                (_List_node_base *)local_1e8) {
                                              local_208._0_8_ =
                                                   ((_List_node_base *)(local_1e8._0_8_ + 0x10))->
                                                   _M_next;
                                              local_208._8_8_ =
                                                   ((_List_node_base *)(local_1e8._0_8_ + 0x10))->
                                                   _M_prev;
                                              std::__cxx11::
                                              list<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
                                              ::pop_front((
                                                  list<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
                                                  *)local_1e8);
                                              p_Var27 = local_178._M_prev;
                                              std::vector<BRDPoint,_std::allocator<BRDPoint>_>::
                                              push_back((vector<BRDPoint,_std::allocator<BRDPoint>_>
                                                         *)local_178._M_prev,(value_type *)local_208
                                                       );
                                              std::vector<BRDPoint,_std::allocator<BRDPoint>_>::
                                              push_back((vector<BRDPoint,_std::allocator<BRDPoint>_>
                                                         *)p_Var27,
                                                        (value_type *)((long)local_208 + 8));
                                              local_e8.x = local_208._0_4_;
                                              local_e8.y = local_208._4_4_;
                                              uVar24 = (ulong)local_208._8_8_ >> 0x20;
                                              uVar35 = (ulong)local_208._0_8_ >> 0x20;
                                              __position_00._M_node =
                                                   (_List_node_base *)local_1e8._0_8_;
                                              vVar29 = (value_type)local_208._8_8_;
                                              vVar25 = (value_type)local_208._0_8_;
                                              if ((_List_node_base *)local_1e8._0_8_ !=
                                                  (_List_node_base *)local_1e8 &&
                                                  (uVar35 != uVar24 ||
                                                  (int)local_208._0_8_ != (int)local_208._8_8_)) {
LAB_001402d9:
                                                do {
                                                  iVar28 = vVar29.x;
                                                  iVar12 = (int)uVar24;
                                                  if ((*(int *)&__position_00._M_node[1]._M_next ==
                                                       iVar28) &&
                                                     (*(int *)((long)&__position_00._M_node[1].
                                                                      _M_next + 4) == iVar12)) {
                                                    p_Var30 = (_List_node_base *)
                                                              &__position_00._M_node[1]._M_prev;
                                                    std::vector<BRDPoint,_std::allocator<BRDPoint>_>
                                                    ::push_back((
                                                  vector<BRDPoint,_std::allocator<BRDPoint>_> *)
                                                  local_178._M_prev,(value_type *)p_Var30);
                                                  }
                                                  else if ((*(int *)&__position_00._M_node[1].
                                                                     _M_prev == iVar28) &&
                                                          (*(int *)((long)&__position_00._M_node[1].
                                                                           _M_prev + 4) == iVar12))
                                                  {
                                                    p_Var30 = __position_00._M_node + 1;
                                                    std::vector<BRDPoint,_std::allocator<BRDPoint>_>
                                                    ::push_back((
                                                  vector<BRDPoint,_std::allocator<BRDPoint>_> *)
                                                  local_178._M_prev,(value_type *)p_Var30);
                                                  }
                                                  else {
                                                    pp_Var8 = &(__position_00._M_node)->_M_next;
                                                    __position_00._M_node = *pp_Var8;
                                                    if (*pp_Var8 != (_List_node_base *)local_1e8)
                                                    goto LAB_001402d9;
                                                    __position_00 =
                                                         std::
                                                  min_element<std::_List_iterator<std::pair<BRDPoint,BRDPoint>>,BVR3File::BVR3File(std::vector<char,std::allocator<char>>&)::__0>
                                                            ((
                                                  _List_iterator<std::pair<BRDPoint,_BRDPoint>_>)
                                                  local_1e8._0_8_,(_List_node_base *)local_1e8,
                                                  (BRDPoint *)((ulong)vVar29 & 0xffffffff));
                                                  p_Var27 = local_178._M_prev;
                                                  iVar13 = iVar28 - vVar25.x;
                                                  iVar7 = -iVar13;
                                                  if (0 < iVar13) {
                                                    iVar7 = iVar13;
                                                  }
                                                  iVar23 = iVar12 - (int)uVar35;
                                                  iVar13 = -iVar23;
                                                  if (0 < iVar23) {
                                                    iVar13 = iVar23;
                                                  }
                                                  iVar18 = iVar28 - *(int *)&__position_00._M_node
                                                                             [1]._M_next;
                                                  iVar23 = -iVar18;
                                                  if (0 < iVar18) {
                                                    iVar23 = iVar18;
                                                  }
                                                  iVar31 = iVar12 - *(int *)((long)&__position_00.
                                                                                    _M_node[1].
                                                                                    _M_next + 4);
                                                  iVar18 = -iVar31;
                                                  if (0 < iVar31) {
                                                    iVar18 = iVar31;
                                                  }
                                                  iVar28 = iVar28 - *(int *)&__position_00._M_node
                                                                             [1]._M_prev;
                                                  iVar31 = -iVar28;
                                                  if (0 < iVar28) {
                                                    iVar31 = iVar28;
                                                  }
                                                  iVar12 = iVar12 - *(int *)((long)&__position_00.
                                                                                    _M_node[1].
                                                                                    _M_prev + 4);
                                                  iVar28 = -iVar12;
                                                  if (0 < iVar12) {
                                                    iVar28 = iVar12;
                                                  }
                                                  if (((uint)(iVar13 + iVar7) <=
                                                       (uint)(iVar18 + iVar23)) &&
                                                     ((uint)(iVar13 + iVar7) <=
                                                      (uint)(iVar28 + iVar31))) {
                                                    std::vector<BRDPoint,_std::allocator<BRDPoint>_>
                                                    ::push_back((
                                                  vector<BRDPoint,_std::allocator<BRDPoint>_> *)
                                                  local_178._M_prev,&local_e8);
                                                  break;
                                                  }
                                                  p_Var32 = __position_00._M_node + 1;
                                                  p_Var30 = (_List_node_base *)
                                                            &__position_00._M_node[1]._M_prev;
                                                  if ((uint)(iVar28 + iVar31) <
                                                      (uint)(iVar18 + iVar23)) {
                                                    std::vector<BRDPoint,_std::allocator<BRDPoint>_>
                                                    ::push_back((
                                                  vector<BRDPoint,_std::allocator<BRDPoint>_> *)
                                                  local_178._M_prev,(value_type *)p_Var30);
                                                  std::vector<BRDPoint,_std::allocator<BRDPoint>_>::
                                                  push_back((
                                                  vector<BRDPoint,_std::allocator<BRDPoint>_> *)
                                                  p_Var27,(value_type *)p_Var32);
                                                  p_Var30 = p_Var32;
                                                  }
                                                  else {
                                                    std::vector<BRDPoint,_std::allocator<BRDPoint>_>
                                                    ::push_back((
                                                  vector<BRDPoint,_std::allocator<BRDPoint>_> *)
                                                  local_178._M_prev,(value_type *)p_Var32);
                                                  std::vector<BRDPoint,_std::allocator<BRDPoint>_>::
                                                  push_back((
                                                  vector<BRDPoint,_std::allocator<BRDPoint>_> *)
                                                  p_Var27,(value_type *)p_Var30);
                                                  }
                                                  }
                                                  vVar29 = (value_type)p_Var30->_M_next;
                                                  std::__cxx11::
                                                  list<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
                                                  ::erase((
                                                  list<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
                                                  *)local_1e8,(const_iterator)__position_00._M_node)
                                                  ;
                                                  uVar24 = (ulong)vVar29 >> 0x20;
                                                  vVar25 = (value_type)
                                                           ((ulong)local_e8 & 0xffffffff);
                                                  uVar35 = (ulong)(uint)local_e8.y;
                                                  if ((local_e8.y == vVar29.y &&
                                                       local_e8.x == vVar29.x) ||
                                                     (__position_00._M_node =
                                                           (_List_node_base *)local_1e8._0_8_,
                                                     (_List_node_base *)local_1e8._0_8_ ==
                                                     (_List_node_base *)local_1e8)) break;
                                                } while( true );
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          ppcVar34 = ppcVar34 + 1;
        } while (ppcVar34 != local_38);
      }
      pBVar9 = local_180;
      pBVar5 = (local_180->super_BRDFileBase).format.
               super__Vector_base<BRDPoint,_std::allocator<BRDPoint>_>._M_impl.
               super__Vector_impl_data._M_finish;
      (local_180->super_BRDFileBase).num_parts =
           (int)((ulong)((long)(local_180->super_BRDFileBase).parts.
                               super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(local_180->super_BRDFileBase).parts.
                              super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 3) * 0x38e38e39;
      (local_180->super_BRDFileBase).num_pins =
           (int)((ulong)((long)(local_180->super_BRDFileBase).pins.
                               super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(local_180->super_BRDFileBase).pins.
                              super__Vector_base<BRDPin,_std::allocator<BRDPin>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 3) * -0x49249249;
      (local_180->super_BRDFileBase).num_format =
           (uint)((ulong)((long)pBVar5 -
                         (long)(local_180->super_BRDFileBase).format.
                               super__Vector_base<BRDPoint,_std::allocator<BRDPoint>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 3);
      (local_180->super_BRDFileBase).num_nails =
           (int)((ulong)((long)(local_180->super_BRDFileBase).nails.
                               super__Vector_base<BRDNail,_std::allocator<BRDNail>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(local_180->super_BRDFileBase).nails.
                              super__Vector_base<BRDNail,_std::allocator<BRDNail>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 3) * -0x55555555;
      setlocale(1,local_40);
      (pBVar9->super_BRDFileBase).valid =
           (pBVar9->super_BRDFileBase).num_format != 0 || (pBVar9->super_BRDFileBase).num_parts != 0
      ;
      if (local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      p_Var27 = (_List_node_base *)local_1e8._0_8_;
      while (p_Var27 != (_List_node_base *)local_1e8) {
        p_Var32 = (((_List_base<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
                     *)&p_Var27->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
        operator_delete(p_Var27,0x20);
        p_Var27 = p_Var32;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d8._M_p != &aStack_c8) {
        operator_delete(local_d8._M_p,aStack_c8._M_allocated_capacity + 1);
      }
      if (local_90 == auStack_80) {
        return;
      }
      operator_delete(local_90,auStack_80[0] + 1);
      return;
    }
    local_108 = local_f8;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_108,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BVR3File.cpp"
               ,"");
    plVar16 = (long *)std::__cxx11::string::append((char *)&local_108);
    pppcVar3 = &local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    puVar19 = (ulong *)(plVar16 + 2);
    if ((pointer *)*plVar16 == (pointer *)puVar19) {
      local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)*puVar19;
      lStack_1b0 = plVar16[3];
      local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)pppcVar3;
    }
    else {
      local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)*puVar19;
      local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)*plVar16;
    }
    local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)plVar16[1];
    *plVar16 = (long)puVar19;
    plVar16[1] = 0;
    *(undefined1 *)(plVar16 + 2) = 0;
    local_1a0._M_next = &local_190;
    std::__cxx11::string::_M_construct((ulong)&local_1a0,'\x02');
    *(undefined2 *)&(local_1a0._M_next)->_M_next = 0x3832;
    p_Var27 = (_List_node_base *)
              ((long)&(local_1a0._M_prev)->_M_next +
              (long)local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                    super__Vector_impl_data._M_finish);
    p_Var32 = (_List_node_base *)0xf;
    if ((pointer *)
        local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
        super__Vector_impl_data._M_start != pppcVar3) {
      p_Var32 = (_List_node_base *)
                local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
    }
    if (p_Var32 < p_Var27) {
      p_Var32 = (_List_node_base *)0xf;
      if (local_1a0._M_next != &local_190) {
        p_Var32 = local_190._M_next;
      }
      if (p_Var27 <= p_Var32) {
        plVar16 = (long *)std::__cxx11::string::replace
                                    ((ulong)&local_1a0,0,(char *)0x0,
                                     (ulong)local_1c8.
                                            super__Vector_base<char_*,_std::allocator<char_*>_>.
                                            _M_impl.super__Vector_impl_data._M_start);
        goto LAB_0014119a;
      }
    }
    plVar16 = (long *)std::__cxx11::string::_M_append((char *)&local_1c8,(ulong)local_1a0._M_next);
LAB_0014119a:
    local_1e8._0_8_ = local_1e8 + 0x10;
    p_Var27 = (_List_node_base *)(plVar16 + 2);
    if ((_List_node_base *)*plVar16 == p_Var27) {
      local_1e8._16_8_ = p_Var27->_M_next;
      lStack_1d0 = plVar16[3];
    }
    else {
      local_1e8._16_8_ = p_Var27->_M_next;
      local_1e8._0_8_ = (_List_node_base *)*plVar16;
    }
    local_1e8._8_8_ = plVar16[1];
    *plVar16 = (long)p_Var27;
    plVar16[1] = 0;
    *(undefined1 *)&p_Var27->_M_next = 0;
    pBVar17 = (BRDPoint *)std::__cxx11::string::append(local_1e8);
    BVar20 = (BRDPoint)(pBVar17 + 2);
    if (*pBVar17 == BVar20) {
      local_118 = *(long *)BVar20;
      BStack_110 = pBVar17[3];
      local_128 = (BRDPoint)&local_118;
    }
    else {
      local_118 = *(long *)BVar20;
      local_128 = *pBVar17;
    }
    BStack_120 = pBVar17[1];
    *pBVar17 = BVar20;
    pBVar17[1].x = 0;
    pBVar17[1].y = 0;
    *(undefined1 *)&pBVar17[2].x = 0;
    plVar16 = (long *)std::__cxx11::string::append((char *)&local_128);
    local_208._0_8_ = (long)local_208 + 0x10;
    p_Var27 = (_List_node_base *)(plVar16 + 2);
    if ((_List_node_base *)*plVar16 == p_Var27) {
      local_208._16_8_ = p_Var27->_M_next;
      p_Stack_1f0 = (_List_node_base *)plVar16[3];
    }
    else {
      local_208._16_8_ = p_Var27->_M_next;
      local_208._0_8_ = (_List_node_base *)*plVar16;
    }
    local_208._8_8_ = *(value_type *)(plVar16 + 1);
    *plVar16 = (long)p_Var27;
    plVar16[1] = 0;
    *(undefined1 *)(plVar16 + 2) = 0;
    pBVar17 = (BRDPoint *)std::__cxx11::string::append((char *)local_208);
    local_168 = (undefined1  [8])&local_158;
    BVar20 = (BRDPoint)(pBVar17 + 2);
    if (*pBVar17 == BVar20) {
      local_158 = *(long *)BVar20;
      BStack_150 = pBVar17[3];
    }
    else {
      local_158 = *(long *)BVar20;
      local_168 = (undefined1  [8])*pBVar17;
    }
    uStack_160 = pBVar17[1];
    *pBVar17 = BVar20;
    pBVar17[1].x = 0;
    pBVar17[1].y = 0;
    *(undefined1 *)&pBVar17[2].x = 0;
    plVar16 = (long *)std::__cxx11::string::append(local_168);
    psVar21 = (size_type *)(plVar16 + 2);
    if ((size_type *)*plVar16 == psVar21) {
      local_d0 = *psVar21;
      aStack_c8._M_allocated_capacity = plVar16[3];
      local_e0 = (undefined1  [8])&local_d0;
    }
    else {
      local_d0 = *psVar21;
      local_e0 = (undefined1  [8])*plVar16;
    }
    local_d8._M_p = (pointer)plVar16[1];
    *plVar16 = (long)psVar21;
    plVar16[1] = 0;
    *(undefined1 *)(plVar16 + 2) = 0;
    plVar16 = (long *)std::__cxx11::string::append(local_e0);
    plVar22 = plVar16 + 2;
    if ((long *)*plVar16 == plVar22) {
      local_88 = *plVar22;
      auStack_80[0] = plVar16[3];
      local_98 = &local_88;
    }
    else {
      local_88 = *plVar22;
      local_98 = (long *)*plVar16;
    }
    local_90 = (ulong *)plVar16[1];
    *plVar16 = (long)plVar22;
    plVar16[1] = 0;
    *(undefined1 *)(plVar16 + 2) = 0;
    psVar2 = &(local_180->super_BRDFileBase).error_msg;
    std::__cxx11::string::operator=((string *)psVar2,(string *)&local_98);
    if (local_98 != &local_88) {
      operator_delete(local_98,local_88 + 1);
    }
    if (local_e0 != (undefined1  [8])&local_d0) {
      operator_delete((void *)local_e0,local_d0 + 1);
    }
    if (local_168 != (undefined1  [8])&local_158) {
      operator_delete((void *)local_168,local_158 + 1);
    }
    if ((_List_node_base *)local_208._0_8_ != (_List_node_base *)((long)local_208 + 0x10U)) {
      operator_delete((void *)local_208._0_8_,
                      (ulong)((long)(_List_node_base **)local_208._16_8_ + 1));
    }
    if (local_128 != (BRDPoint)&local_118) {
      operator_delete((void *)local_128,local_118 + 1);
    }
    if ((_List_node_base *)local_1e8._0_8_ != (_List_node_base *)(local_1e8 + 0x10)) {
      operator_delete((void *)local_1e8._0_8_,
                      (ulong)((long)(_List_node_base **)local_1e8._16_8_ + 1));
    }
    if (local_1a0._M_next != &local_190) {
      operator_delete(local_1a0._M_next,(ulong)((long)&(local_190._M_next)->_M_next + 1));
    }
    if ((pointer *)
        local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        &local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage) {
      operator_delete(local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (ulong)((long)(_List_node_base **)
                                    local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
    }
    if (local_108 != local_f8) {
      operator_delete(local_108,local_f8[0] + 1);
    }
    SDL_LogError(1,"%s",(psVar2->_M_dataplus)._M_p);
    return;
  }
  local_108 = local_f8;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_108,
             "/workspace/llm4binary/github/license_c_cmakelists/OpenBoardView[P]OpenBoardView/src/openboardview/FileFormats/BVR3File.cpp"
             ,"");
  plVar16 = (long *)std::__cxx11::string::append((char *)&local_108);
  pppcVar3 = &local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  puVar19 = (ulong *)(plVar16 + 2);
  if ((pointer *)*plVar16 == (pointer *)puVar19) {
    local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)*puVar19;
    lStack_1b0 = plVar16[3];
    local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)pppcVar3;
  }
  else {
    local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)*puVar19;
    local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)*plVar16;
  }
  local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)plVar16[1];
  *plVar16 = (long)puVar19;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  local_1a0._M_next = &local_190;
  std::__cxx11::string::_M_construct((ulong)&local_1a0,'\x02');
  *(undefined2 *)&(local_1a0._M_next)->_M_next = 0x3532;
  p_Var27 = (_List_node_base *)
            ((long)&(local_1a0._M_prev)->_M_next +
            (long)local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                  super__Vector_impl_data._M_finish);
  p_Var32 = (_List_node_base *)0xf;
  if ((pointer *)
      local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
      _M_start != pppcVar3) {
    p_Var32 = (_List_node_base *)
              local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
  }
  if (p_Var32 < p_Var27) {
    p_Var32 = (_List_node_base *)0xf;
    if (local_1a0._M_next != &local_190) {
      p_Var32 = local_190._M_next;
    }
    if (p_Var27 <= p_Var32) {
      plVar16 = (long *)std::__cxx11::string::replace
                                  ((ulong)&local_1a0,0,(char *)0x0,
                                   (ulong)local_1c8.
                                          super__Vector_base<char_*,_std::allocator<char_*>_>.
                                          _M_impl.super__Vector_impl_data._M_start);
      goto LAB_00140d7b;
    }
  }
  plVar16 = (long *)std::__cxx11::string::_M_append((char *)&local_1c8,(ulong)local_1a0._M_next);
LAB_00140d7b:
  local_1e8._0_8_ = local_1e8 + 0x10;
  p_Var27 = (_List_node_base *)(plVar16 + 2);
  if ((_List_node_base *)*plVar16 == p_Var27) {
    local_1e8._16_8_ = p_Var27->_M_next;
    lStack_1d0 = plVar16[3];
  }
  else {
    local_1e8._16_8_ = p_Var27->_M_next;
    local_1e8._0_8_ = (_List_node_base *)*plVar16;
  }
  local_1e8._8_8_ = plVar16[1];
  *plVar16 = (long)p_Var27;
  plVar16[1] = 0;
  *(undefined1 *)&p_Var27->_M_next = 0;
  pBVar17 = (BRDPoint *)std::__cxx11::string::append(local_1e8);
  BVar20 = (BRDPoint)(pBVar17 + 2);
  if (*pBVar17 == BVar20) {
    local_118 = *(long *)BVar20;
    BStack_110 = pBVar17[3];
    local_128 = (BRDPoint)&local_118;
  }
  else {
    local_118 = *(long *)BVar20;
    local_128 = *pBVar17;
  }
  BStack_120 = pBVar17[1];
  *pBVar17 = BVar20;
  pBVar17[1].x = 0;
  pBVar17[1].y = 0;
  *(undefined1 *)&pBVar17[2].x = 0;
  plVar16 = (long *)std::__cxx11::string::append((char *)&local_128);
  local_208._0_8_ = (long)local_208 + 0x10;
  p_Var27 = (_List_node_base *)(plVar16 + 2);
  if ((_List_node_base *)*plVar16 == p_Var27) {
    local_208._16_8_ = p_Var27->_M_next;
    p_Stack_1f0 = (_List_node_base *)plVar16[3];
  }
  else {
    local_208._16_8_ = p_Var27->_M_next;
    local_208._0_8_ = (_List_node_base *)*plVar16;
  }
  local_208._8_8_ = *(value_type *)(plVar16 + 1);
  *plVar16 = (long)p_Var27;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  pBVar17 = (BRDPoint *)std::__cxx11::string::append((char *)local_208);
  BVar20 = (BRDPoint)(pBVar17 + 2);
  if (*pBVar17 == BVar20) {
    local_158 = *(long *)BVar20;
    BStack_150 = pBVar17[3];
    local_168 = (undefined1  [8])&local_158;
  }
  else {
    local_158 = *(long *)BVar20;
    local_168 = (undefined1  [8])*pBVar17;
  }
  uStack_160 = pBVar17[1];
  *pBVar17 = BVar20;
  pBVar17[1].x = 0;
  pBVar17[1].y = 0;
  *(undefined1 *)&pBVar17[2].x = 0;
  plVar16 = (long *)std::__cxx11::string::append(local_168);
  psVar21 = (size_type *)(plVar16 + 2);
  if ((size_type *)*plVar16 == psVar21) {
    local_d0 = *psVar21;
    aStack_c8._M_allocated_capacity = plVar16[3];
    local_e0 = (undefined1  [8])&local_d0;
  }
  else {
    local_d0 = *psVar21;
    local_e0 = (undefined1  [8])*plVar16;
  }
  local_d8._M_p = (pointer)plVar16[1];
  *plVar16 = (long)psVar21;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  plVar16 = (long *)std::__cxx11::string::append(local_e0);
  plVar22 = plVar16 + 2;
  if ((long *)*plVar16 == plVar22) {
    local_88 = *plVar22;
    auStack_80[0] = plVar16[3];
    local_98 = &local_88;
  }
  else {
    local_88 = *plVar22;
    local_98 = (long *)*plVar16;
  }
  local_90 = (ulong *)plVar16[1];
  *plVar16 = (long)plVar22;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  psVar2 = &(local_180->super_BRDFileBase).error_msg;
  std::__cxx11::string::operator=((string *)psVar2,(string *)&local_98);
  if (local_98 != &local_88) {
    operator_delete(local_98,local_88 + 1);
  }
  if (local_e0 != (undefined1  [8])&local_d0) {
    operator_delete((void *)local_e0,local_d0 + 1);
  }
  if (local_168 != (undefined1  [8])&local_158) {
    operator_delete((void *)local_168,local_158 + 1);
  }
  if ((_List_node_base *)local_208._0_8_ != (_List_node_base *)((long)local_208 + 0x10U)) {
    operator_delete((void *)local_208._0_8_,(ulong)((long)(_List_node_base **)local_208._16_8_ + 1))
    ;
  }
  if (local_128 != (BRDPoint)&local_118) {
    operator_delete((void *)local_128,local_118 + 1);
  }
  if ((_List_node_base *)local_1e8._0_8_ != (_List_node_base *)(local_1e8 + 0x10)) {
    operator_delete((void *)local_1e8._0_8_,(ulong)((long)(_List_node_base **)local_1e8._16_8_ + 1))
    ;
  }
  if (local_1a0._M_next != &local_190) {
    operator_delete(local_1a0._M_next,(ulong)((long)&(local_190._M_next)->_M_next + 1));
  }
  if ((pointer *)
      local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data.
      _M_start !=
      &local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.super__Vector_impl_data
       ._M_end_of_storage) {
    operator_delete(local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (ulong)((long)(_List_node_base **)
                                  local_1c8.super__Vector_base<char_*,_std::allocator<char_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
  }
  if (local_108 != local_f8) {
    operator_delete(local_108,local_f8[0] + 1);
  }
  SDL_LogError(1,"%s",(psVar2->_M_dataplus)._M_p);
  return;
}

Assistant:

BVR3File::BVR3File(std::vector<char> &buf) {
	auto buffer_size = buf.size();

	char *saved_locale = setlocale(LC_NUMERIC, "C"); // Use '.' as delimiter for strtod

	ENSURE_OR_FAIL(buffer_size > 4, error_msg, return);
	size_t file_buf_size = 3 * (1 + buffer_size);
	file_buf             = (char *)calloc(1, file_buf_size);
	ENSURE_OR_FAIL(file_buf != nullptr, error_msg, return);

	std::copy(buf.begin(), buf.end(), file_buf);
	file_buf[buffer_size] = 0;
	// This is for fixing degenerate utf8
	char *arena     = &file_buf[buffer_size + 1];
	char *arena_end = file_buf + file_buf_size - 1;
	*arena_end      = 0;

	BRDPart blank_part;
	BRDPin blank_pin;
	BRDPart part;
	BRDPin pin;
	std::list<std::pair<BRDPoint, BRDPoint>> outline_segments;

	std::vector<char *> lines;
	stringfile(file_buf, lines);

	for (char *line : lines) {
		while (isspace((uint8_t)*line)) line++;
		if (!line[0]) continue;

		char *p = line;
		char *s;

		if (!strncmp(line, "PART_NAME ", 10)) {
			p += 10;
			part.name = READ_STR();
		} else if (!strncmp(line, "PART_SIDE ", 10)) {
			p += 10;
			char *side = READ_STR();
			if (!strcmp(side, "T"))
				part.mounting_side = BRDPartMountingSide::Top;
			else if (!strcmp(side, "B"))
				part.mounting_side = BRDPartMountingSide::Bottom;
			else if (!strcmp(side, "O"))
				part.mounting_side = BRDPartMountingSide::Both;
		} else if (!strncmp(line, "PART_ORIGIN ", 12)) {
			// Value ignored, used as reference point for relative pin placements, not currently supported
		} else if (!strncmp(line, "PART_MOUNT ", 11)) {
			p += 11;
			char *mount = READ_STR();
			if (!strcmp(mount, "SMD"))
				part.part_type = BRDPartType::SMD;
			else
				part.part_type = BRDPartType::ThroughHole;
		} else if (!strncmp(line, "PART_OUTLINE_RELATIVE ", 22)) {
			// Value ignored, custom outline for parts not yet supported
		} else if (!strncmp(line, "PIN_ID ", 7)) {
			// Value ignored, not currently relevant for BRDPin
		} else if (!strncmp(line, "PIN_NUMBER ", 11)) {
			p += 11;
			pin.snum = READ_STR();
		} else if (!strncmp(line, "PIN_NAME ", 9)) {
			p += 9;
			pin.name = READ_STR();
		} else if (!strncmp(line, "PIN_SIDE ", 9)) {
			p += 9;
			char *side = READ_STR();
			if (!strcmp(side, "T"))
				pin.side = BRDPinSide::Top;
			else if (!strcmp(side, "B"))
				pin.side = BRDPinSide::Bottom;
			else if (!strcmp(side, "O"))
				pin.side = BRDPinSide::Both;
		} else if (!strncmp(line, "PIN_ORIGIN ", 11)) {
			p += 11;
			double origin_x = READ_DOUBLE();
			pin.pos.x = trunc(origin_x);
			double origin_y = READ_DOUBLE();
			pin.pos.y = trunc(origin_y);
		} else if (!strncmp(line, "PIN_RADIUS ", 11)) {
			p += 11;
			pin.radius = READ_DOUBLE();
		} else if (!strncmp(line, "PIN_NET ", 8)) {
			p += 8;
			pin.net = READ_STR();
		} else if (!strncmp(line, "PIN_TYPE ", 9)) {
			// Value ignored, not currently relevant for BRDPin
		} else if (!strncmp(line, "PIN_COMMENT ", 12)) {
			// Value ignored, not currently relevant for BRDPin
		} else if (!strncmp(line, "PIN_OUTLINE_RELATIVE ", 21)) {
			// Value ignored, custom outline for pins not yet supported
		} else if (!strcmp(line, "PIN_END")) {
			pin.part = parts.size() + 1; // pin is for current part, which will not yet have been added to parts vector
			pins.push_back(pin);
			pin = blank_pin;
		} else if (!strcmp(line, "PART_END")) {
			part.end_of_pins = pins.size();
			parts.push_back(part);
			part = blank_part;
		} else if (!strncmp(line, "OUTLINE_POINTS ", 15)) {
			p += 15;
			while (p[0]) {
				auto pold = p;
				BRDPoint point;
				double x = READ_DOUBLE();
				point.x  = trunc(x);
				double y = READ_DOUBLE();
				point.y  = trunc(y);
				// Nothing was read, probably end of list
				if (pold == p) {
					break;
				}
				format.push_back(point);
			}
		} else if (!strncmp(line, "OUTLINE_SEGMENTED ", 18)) {
			p += 18;
			while (p[0]) {
				auto pold = p;
				std::pair<BRDPoint, BRDPoint> outline_segment;
				double x = READ_DOUBLE();
				outline_segment.first.x  = trunc(x);
				double y = READ_DOUBLE();
				outline_segment.first.y  = trunc(y);
				x = READ_DOUBLE();
				outline_segment.second.x = trunc(x);
				y = READ_DOUBLE();
				outline_segment.second.y = trunc(y);
				// Nothing was read, probably end of list
				if (pold == p) {
					break;
				}
				outline_segments.push_back(outline_segment);
			}

			if (outline_segments.empty())
				continue;

			// Get first segment and add both points to format
			auto first_outline_segment = outline_segments.front();
			outline_segments.pop_front();
			format.push_back(first_outline_segment.first);
			format.push_back(first_outline_segment.second);

			// Loop through remaining segments picking the best candidate for the next segment
			BRDPoint start_point = first_outline_segment.first;
			BRDPoint end_point = first_outline_segment.second;
			while (start_point != end_point && !outline_segments.empty()) {
				// Loop through segments checking for exact match between points
				auto it = outline_segments.begin();
				bool match_found = false;
				while (it != outline_segments.end()) {
					// If exact match found on either first or second point, add other point to format and remove segment
					if (end_point == it->first) {
						format.push_back(it->second);
						end_point = it->second;
						outline_segments.erase(it);
						match_found = true;
						break;
					} else if (end_point == it->second) {
						format.push_back(it->first);
						end_point = it->first;
						outline_segments.erase(it);
						match_found = true;
						break;
					}
					it++;
				}
				if (match_found)
					continue;

				// Exact match not found, so pick nearest segment instead
				it = std::min_element(
					outline_segments.begin(),
					outline_segments.end(),
					[&end_point](const std::pair<BRDPoint, BRDPoint> &os1, const std::pair<BRDPoint, BRDPoint> &os2) {
						return std::min(manhattan_distance(end_point, os1.first), manhattan_distance(end_point, os1.second))
							< std::min(manhattan_distance(end_point, os2.first), manhattan_distance(end_point, os2.second));
					});

				// Calculate distances for comparison
				auto start_point_distance = manhattan_distance(end_point, start_point);
				auto segment_distance_first = manhattan_distance(end_point, it->first);
				auto segment_distance_second = manhattan_distance(end_point, it->second);

				// If start point is closer than both nearest segment points, format path more likely to be complete
				if (start_point_distance <= segment_distance_first && start_point_distance <= segment_distance_second) {
					format.push_back(start_point);
					end_point = start_point;
					break;
				}

				// Otherwise add points from nearest segment to format with closest point first, then remove segment
				if (segment_distance_first <= segment_distance_second) {
					format.push_back(it->first);
					format.push_back(it->second);
					end_point = it->second;
					outline_segments.erase(it);
				} else {
					format.push_back(it->second);
					format.push_back(it->first);
					end_point = it->first;
					outline_segments.erase(it);
				}
			}
		}
	}

	num_parts  = parts.size();
	num_pins   = pins.size();
	num_format = format.size();
	num_nails  = nails.size();

	setlocale(LC_NUMERIC, saved_locale); // Restore locale

	valid = num_parts > 0 || num_format > 0;
}